

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O3

REF_STATUS ref_shard_in_place(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_ADJ pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  REF_CELL pRVar6;
  char *pcVar7;
  REF_INT RVar8;
  int iVar9;
  long lVar10;
  REF_INT nodes [27];
  REF_INT aRStack_a8 [30];
  
  ref_node = ref_grid->node;
  pRVar6 = ref_grid->cell[6];
  if (0 < pRVar6->max) {
    RVar8 = 0;
    do {
      RVar2 = ref_cell_nodes(pRVar6,RVar8,aRStack_a8);
      if ((RVar2 == 0) &&
         (uVar3 = ref_shard_add_qua_as_tri(ref_node,ref_grid->cell[3],aRStack_a8), uVar3 != 0)) {
        uVar5 = (ulong)uVar3;
        pcVar7 = "add qua tri";
        uVar4 = 0x4a6;
        goto LAB_00177119;
      }
      RVar8 = RVar8 + 1;
      pRVar6 = ref_grid->cell[6];
    } while (RVar8 < pRVar6->max);
  }
  uVar3 = ref_cell_free(pRVar6);
  if (uVar3 == 0) {
    uVar3 = ref_cell_create(ref_grid->cell + 6,REF_CELL_QUA);
    if (uVar3 == 0) {
      pRVar6 = ref_grid->cell[9];
      if (0 < pRVar6->max) {
        RVar8 = 0;
        do {
          RVar2 = ref_cell_nodes(pRVar6,RVar8,aRStack_a8);
          if ((RVar2 == 0) &&
             (uVar3 = ref_shard_add_pyr_as_tet(ref_node,ref_grid->cell[8],aRStack_a8,0), uVar3 != 0)
             ) {
            uVar5 = (ulong)uVar3;
            pcVar7 = "add pyr tet";
            uVar4 = 0x4ae;
            goto LAB_00177119;
          }
          RVar8 = RVar8 + 1;
          pRVar6 = ref_grid->cell[9];
        } while (RVar8 < pRVar6->max);
      }
      uVar3 = ref_cell_free(pRVar6);
      if (uVar3 == 0) {
        uVar3 = ref_cell_create(ref_grid->cell + 9,REF_CELL_PYR);
        if (uVar3 == 0) {
          pRVar6 = ref_grid->cell[10];
          if (0 < pRVar6->max) {
            RVar8 = 0;
            do {
              RVar2 = ref_cell_nodes(pRVar6,RVar8,aRStack_a8);
              if ((RVar2 == 0) &&
                 (uVar3 = ref_shard_add_pri_as_tet(ref_node,ref_grid->cell[8],aRStack_a8,0),
                 uVar3 != 0)) {
                uVar5 = (ulong)uVar3;
                pcVar7 = "add pri tet";
                uVar4 = 0x4b6;
                goto LAB_00177119;
              }
              RVar8 = RVar8 + 1;
              pRVar6 = ref_grid->cell[10];
            } while (RVar8 < pRVar6->max);
          }
          uVar3 = ref_cell_free(pRVar6);
          if (uVar3 == 0) {
            uVar3 = ref_cell_create(ref_grid->cell + 10,REF_CELL_PRI);
            if (uVar3 == 0) {
              pRVar6 = ref_grid->cell[0xb];
              if (0 < pRVar6->max) {
                iVar9 = 0;
                do {
                  RVar2 = ref_cell_nodes(pRVar6,iVar9,aRStack_a8);
                  if ((RVar2 == 0) &&
                     (uVar3 = ref_shard_add_hex_as_tet(ref_node,ref_grid->cell[8],aRStack_a8),
                     uVar3 != 0)) {
                    uVar5 = (ulong)uVar3;
                    pcVar7 = "add hex tet";
                    uVar4 = 0x4bd;
                    goto LAB_00177119;
                  }
                  iVar9 = iVar9 + 1;
                  pRVar6 = ref_grid->cell[0xb];
                } while (iVar9 < pRVar6->max);
              }
              uVar3 = ref_cell_free(pRVar6);
              if (uVar3 == 0) {
                uVar3 = ref_cell_create(ref_grid->cell + 0xb,REF_CELL_HEX);
                if (uVar3 == 0) {
                  iVar9 = ref_node->max;
                  if (iVar9 < 1) {
                    return 0;
                  }
                  lVar10 = 0;
                  do {
                    if (((-1 < ref_node->global[lVar10]) &&
                        ((pRVar1 = ref_grid->cell[3]->ref_adj, pRVar1->nnode <= lVar10 ||
                         (pRVar1->first[lVar10] == -1)))) &&
                       ((pRVar1 = ref_grid->cell[8]->ref_adj, pRVar1->nnode <= lVar10 ||
                        (pRVar1->first[lVar10] == -1)))) {
                      uVar3 = ref_node_remove_without_global(ref_node,(REF_INT)lVar10);
                      if (uVar3 != 0) {
                        uVar5 = (ulong)uVar3;
                        pcVar7 = "hanging node";
                        uVar4 = 0x4c5;
                        goto LAB_00177119;
                      }
                      iVar9 = ref_node->max;
                    }
                    lVar10 = lVar10 + 1;
                    if (iVar9 <= lVar10) {
                      return 0;
                    }
                  } while( true );
                }
                uVar5 = (ulong)uVar3;
                pcVar7 = "hex create";
                uVar4 = 0x4c0;
              }
              else {
                uVar5 = (ulong)uVar3;
                pcVar7 = "free hex";
                uVar4 = 0x4bf;
              }
            }
            else {
              uVar5 = (ulong)uVar3;
              pcVar7 = "pri create";
              uVar4 = 0x4b9;
            }
          }
          else {
            uVar5 = (ulong)uVar3;
            pcVar7 = "free pri";
            uVar4 = 0x4b8;
          }
        }
        else {
          uVar5 = (ulong)uVar3;
          pcVar7 = "pyr create";
          uVar4 = 0x4b1;
        }
      }
      else {
        uVar5 = (ulong)uVar3;
        pcVar7 = "free pyr";
        uVar4 = 0x4b0;
      }
    }
    else {
      uVar5 = (ulong)uVar3;
      pcVar7 = "qua create";
      uVar4 = 0x4a9;
    }
  }
  else {
    uVar5 = (ulong)uVar3;
    pcVar7 = "free qua";
    uVar4 = 0x4a8;
  }
LAB_00177119:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar4,
         "ref_shard_in_place",uVar5,pcVar7);
  return (REF_STATUS)uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_shard_in_place(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL check_volume = REF_FALSE;

  each_ref_cell_valid_cell_with_nodes(ref_grid_qua(ref_grid), cell, nodes) {
    RSS(ref_shard_add_qua_as_tri(ref_node, ref_grid_tri(ref_grid), nodes),
        "add qua tri");
  }
  RSS(ref_cell_free(ref_grid_qua(ref_grid)), "free qua");
  RSS(ref_cell_create(&ref_grid_qua(ref_grid), REF_CELL_QUA), "qua create");

  each_ref_cell_valid_cell_with_nodes(ref_grid_pyr(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pyr_as_tet(ref_node, ref_grid_tet(ref_grid), nodes,
                                 check_volume),
        "add pyr tet");
  }
  RSS(ref_cell_free(ref_grid_pyr(ref_grid)), "free pyr");
  RSS(ref_cell_create(&ref_grid_pyr(ref_grid), REF_CELL_PYR), "pyr create");

  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pri_as_tet(ref_node, ref_grid_tet(ref_grid), nodes,
                                 check_volume),
        "add pri tet");
  }
  RSS(ref_cell_free(ref_grid_pri(ref_grid)), "free pri");
  RSS(ref_cell_create(&ref_grid_pri(ref_grid), REF_CELL_PRI), "pri create");

  each_ref_cell_valid_cell_with_nodes(ref_grid_hex(ref_grid), cell, nodes) {
    RSS(ref_shard_add_hex_as_tet(ref_node, ref_grid_tet(ref_grid), nodes),
        "add hex tet");
  }
  RSS(ref_cell_free(ref_grid_hex(ref_grid)), "free hex");
  RSS(ref_cell_create(&ref_grid_hex(ref_grid), REF_CELL_HEX), "hex create");

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node)) {
      RSS(ref_node_remove_without_global(ref_node, node), "hanging node");
    }
  }

  return REF_SUCCESS;
}